

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

bool __thiscall
pybind11::detail::
list_caster<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::pair<unsigned_int,_unsigned_int>_>
::load(list_caster<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::pair<unsigned_int,_unsigned_int>_>
       *this,handle src,bool convert)

{
  pointer ppVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  sequence_iterator sVar5;
  sequence s;
  value_conv conv;
  reference it;
  handle local_80;
  pair<unsigned_int,_unsigned_int> local_78;
  handle local_70;
  pair<unsigned_int,_unsigned_int> local_68;
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  *local_60;
  PyObject *local_58;
  PyObject *local_48;
  long local_40;
  object local_38;
  
  bVar2 = sequence::check_(src);
  if (bVar2) {
    if (src.m_ptr == (PyObject *)0x0) {
      local_80.m_ptr = (PyObject *)0x0;
    }
    else {
      if (((src.m_ptr)->ob_type->tp_flags & 0x18000000) != 0) goto LAB_0018eb3a;
      (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
      local_80.m_ptr = src.m_ptr;
    }
    ppVar1 = (this->value).
             super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->value).
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppVar1) {
      (this->value).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
    }
    if (local_80.m_ptr != (PyObject *)0x0) {
      (local_80.m_ptr)->ob_refcnt = (local_80.m_ptr)->ob_refcnt + 1;
    }
    local_70.m_ptr = local_80.m_ptr;
    reserve_maybe<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_0>
              (this,(sequence *)&local_70,&this->value);
    object::~object((object *)&local_70);
    local_58 = local_80.m_ptr;
    sVar5 = sequence::end((sequence *)&local_80);
    local_60 = (vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                *)this;
    for (lVar4 = 0; bVar2 = sVar5.super_sequence_slow_readwrite.index == lVar4, !bVar2;
        lVar4 = lVar4 + 1) {
      local_48 = local_58;
      local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
      local_68.first = 0;
      local_68.second = 0;
      local_40 = lVar4;
      accessor::operator_cast_to_object((accessor *)&local_78);
      bVar3 = tuple_caster<std::pair,_unsigned_int,_unsigned_int>::load
                        ((tuple_caster<std::pair,_unsigned_int,_unsigned_int> *)&local_68,
                         (handle)local_78,convert);
      object::~object((object *)&local_78);
      if (!bVar3) {
        object::~object(&local_38);
        break;
      }
      local_78 = local_68;
      std::
      vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
      ::emplace_back<std::pair<unsigned_int,unsigned_int>>(local_60,&local_78);
      object::~object(&local_38);
    }
    object::~object((object *)&local_80);
  }
  else {
LAB_0018eb3a:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }